

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

string * __thiscall
cs_impl::any::holder<cs::structure>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<cs::structure> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  proxy *ppVar2;
  char *__s1;
  long lVar3;
  int iVar4;
  size_t sVar5;
  var *pvVar6;
  undefined4 extraout_var;
  undefined *puVar7;
  long *plVar8;
  size_type *psVar9;
  var func;
  any local_60;
  key_arg<std::__cxx11::basic_string<char>_> local_58;
  any local_38;
  structure *local_30;
  
  paVar1 = &local_58.field_2;
  local_58.field_2._M_allocated_capacity = 0x6e697274735f6f74;
  local_58.field_2._8_2_ = 0x67;
  local_58._M_string_length = 9;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  sVar5 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)(this->mDat).m_data.
                        super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (sVar5 != 0) {
    local_58.field_2._M_allocated_capacity = 0x6e697274735f6f74;
    local_58.field_2._8_2_ = 0x67;
    local_58._M_string_length = 9;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    pvVar6 = cs::domain_type::get_var
                       ((this->mDat).m_data.
                        super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &local_58);
    ppVar2 = pvVar6->mDat;
    if (ppVar2 != (proxy *)0x0) {
      ppVar2->refcount = ppVar2->refcount + 1;
    }
    local_60.mDat = ppVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (ppVar2 == (proxy *)0x0) {
      puVar7 = &void::typeinfo;
    }
    else {
      iVar4 = (*ppVar2->data->_vptr_baseHolder[2])();
      puVar7 = (undefined *)CONCAT44(extraout_var,iVar4);
    }
    __s1 = *(char **)(puVar7 + 8);
    if ((__s1 == "N2cs8callableE") ||
       ((*__s1 != '*' && (iVar4 = strcmp(__s1,"N2cs8callableE"), iVar4 == 0)))) {
      local_30 = &this->mDat;
      make<cs::structure,cs::structure_const*>(&local_38,&local_30);
      cs::invoke<cs_impl::any>((cs *)&local_58,&local_60,&local_38);
      any::to_string_abi_cxx11_(__return_storage_ptr__,(any *)&local_58);
      recycle((any *)&local_58);
      recycle(&local_38);
      recycle(&local_60);
      return __return_storage_ptr__;
    }
    recycle(&local_60);
  }
  std::operator+(&local_58,"[cs::structure_",&(this->mDat).m_name);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar9) {
    lVar3 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}